

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# typemapper.hpp
# Opt level: O0

MethodHandle * __thiscall
jsonrpccxx::methodHandle<SomeClass,int,int,int>
          (MethodHandle *__return_storage_ptr__,jsonrpccxx *this,offset_in_SomeClass_to_subr method,
          SomeClass *instance)

{
  function<int_(int,_int)> *method_00;
  function<int_(int,_int)> local_90;
  anon_class_24_2_b747b145 local_70;
  undefined1 local_58 [8];
  function<int_(int,_int)> function;
  SomeClass *instance_local;
  offset_in_SomeClass_to_subr method_local;
  
  local_70.instance = instance;
  local_70.method = (offset_in_SomeClass_to_subr)this;
  local_70._16_8_ = method;
  function._M_invoker = (_Invoker_type)instance;
  std::function<int(int,int)>::
  function<jsonrpccxx::methodHandle<SomeClass,int,int,int>(int(SomeClass::*)(int,int),SomeClass&)::_lambda(int&&,int&&)_1_,void>
            ((function<int(int,int)> *)local_58,&local_70);
  std::function<int_(int,_int)>::function(&local_90,(function<int_(int,_int)> *)local_58);
  methodHandle<int,int,int>(__return_storage_ptr__,(jsonrpccxx *)&local_90,method_00);
  std::function<int_(int,_int)>::~function(&local_90);
  std::function<int_(int,_int)>::~function((function<int_(int,_int)> *)local_58);
  return __return_storage_ptr__;
}

Assistant:

MethodHandle methodHandle(ReturnType (T::*method)(ParamTypes...), T &instance) {
    std::function<ReturnType(ParamTypes...)> function = [&instance, method](ParamTypes &&... params) -> ReturnType {
      return (instance.*method)(std::forward<ParamTypes>(params)...);
    };
    return methodHandle(function);
  }